

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int bindText(sqlite3_stmt *pStmt,int i,void *zData,int nData,_func_void_void_ptr *xDel,u8 encoding)

{
  Mem *pMem;
  int local_4c;
  int rc;
  Mem *pVar;
  Vdbe *p;
  u8 encoding_local;
  _func_void_void_ptr *xDel_local;
  int nData_local;
  void *zData_local;
  int i_local;
  sqlite3_stmt *pStmt_local;
  
  local_4c = vdbeUnbind((Vdbe *)pStmt,i);
  if (local_4c == 0) {
    if (zData != (void *)0x0) {
      pMem = (Mem *)(*(long *)(pStmt + 0x78) + (long)(i + -1) * 0x38);
      local_4c = sqlite3VdbeMemSetStr(pMem,(char *)zData,nData,encoding,xDel);
      if ((local_4c == 0) && (encoding != '\0')) {
        local_4c = sqlite3VdbeChangeEncoding
                             (pMem,(uint)*(byte *)(*(long *)(*(long *)(*(long *)pStmt + 0x20) + 0x18
                                                            ) + 0x71));
      }
      sqlite3Error(*(sqlite3 **)pStmt,local_4c,(char *)0x0);
      local_4c = sqlite3ApiExit(*(sqlite3 **)pStmt,local_4c);
    }
    sqlite3_mutex_leave(*(sqlite3_mutex **)(*(long *)pStmt + 0x18));
  }
  else if ((xDel != (_func_void_void_ptr *)0x0) &&
          (xDel != (_func_void_void_ptr *)0xffffffffffffffff)) {
    (*xDel)(zData);
  }
  return local_4c;
}

Assistant:

static int bindText(
  sqlite3_stmt *pStmt,   /* The statement to bind against */
  int i,                 /* Index of the parameter to bind */
  const void *zData,     /* Pointer to the data to be bound */
  int nData,             /* Number of bytes of data to be bound */
  void (*xDel)(void*),   /* Destructor for the data */
  u8 encoding            /* Encoding for the data */
){
  Vdbe *p = (Vdbe *)pStmt;
  Mem *pVar;
  int rc;

  rc = vdbeUnbind(p, i);
  if( rc==SQLITE_OK ){
    if( zData!=0 ){
      pVar = &p->aVar[i-1];
      rc = sqlite3VdbeMemSetStr(pVar, zData, nData, encoding, xDel);
      if( rc==SQLITE_OK && encoding!=0 ){
        rc = sqlite3VdbeChangeEncoding(pVar, ENC(p->db));
      }
      sqlite3Error(p->db, rc, 0);
      rc = sqlite3ApiExit(p->db, rc);
    }
    sqlite3_mutex_leave(p->db->mutex);
  }else if( xDel!=SQLITE_STATIC && xDel!=SQLITE_TRANSIENT ){
    xDel((void*)zData);
  }
  return rc;
}